

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
          (BasicAllFormatsLoadStoreComputeStage *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value,GLenum format,GLenum type)

{
  CallLogWrapper *this_00;
  ShaderImageLoadStoreBase *this_01;
  bool bVar1;
  GLuint program;
  GLuint program_00;
  ostream *poVar2;
  TestLog **this_02;
  undefined8 uVar3;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  ivec4 *extraout_RDX;
  ivec4 *b;
  ivec4 *extraout_RDX_00;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  char *pcVar4;
  ulong uVar5;
  GLuint texture [2];
  GLuint m_buffer;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> out_data;
  string local_270;
  string local_250;
  ShortByteData<tcu::Vector<int,_4>_> d;
  string local_1e8;
  ShaderImageLoadStoreBase local_1c8 [16];
  ShaderImageLoadStoreBase local_1b8 [16];
  ostringstream os;
  
  this_01 = (ShaderImageLoadStoreBase *)(ulong)internalformat;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar2 = std::operator<<((ostream *)&os,
                           "\n#define KSIZE 8\nlayout(local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout("
                          );
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_((string *)&d,this_01,e);
  poVar2 = std::operator<<(poVar2,(string *)&d);
  pcVar4 = ", binding = 2) readonly uniform ";
  poVar2 = std::operator<<(poVar2,", binding = 2) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_250,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"image2D g_image_read;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_270,this_01,e_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  pcVar4 = ", binding = 3) writeonly uniform ";
  poVar2 = std::operator<<(poVar2,", binding = 3) writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            ((string *)&out_data,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&out_data);
  pcVar4 = "image2D g_image_write;\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  "
  ;
  poVar2 = std::operator<<(poVar2,
                           "image2D g_image_write;\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            ((string *)&m_buffer,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&m_buffer);
  pcVar4 = 
  "vec4 v = imageLoad(g_image_read, coord);\n  imageStore(g_image_write, coord, v+v);\n  //imageStore(g_image_write, coord, "
  ;
  poVar2 = std::operator<<(poVar2,
                           "vec4 v = imageLoad(g_image_read, coord);\n  imageStore(g_image_write, coord, v+v);\n  //imageStore(g_image_write, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            ((string *)texture,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)texture);
  poVar2 = std::operator<<(poVar2,"vec4");
  poVar2 = tcu::operator<<(poVar2,expected_value);
  std::operator<<(poVar2,");\n}");
  std::__cxx11::string::~string((string *)texture);
  std::__cxx11::string::~string((string *)&m_buffer);
  std::__cxx11::string::~string((string *)&out_data);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  program = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                      ((ShaderImageLoadStoreBase *)this,&local_1e8,false);
  std::__cxx11::string::~string((string *)&local_1e8);
  glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::ShortByteData
            (&d,8,value,internalformat,format);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,2,texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,8,8);
  if (((internalformat != 0x8d88) && (internalformat != 0x8d76)) &&
     (bVar1 = glcts::anon_unknown_0::Bytes(internalformat),
     d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
     _M_start = (pointer)d.data.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, bVar1)) {
    d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  }
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,0,0,0,8,8,format,type,
             d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,8,8);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,texture[0],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,texture[1],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[1]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  pcVar4 = "\n#define KSIZE 8\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform ";
  poVar2 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\n#define KSIZE 8\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_250,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  pcVar4 = "sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ";
  poVar2 = std::operator<<(poVar2,"sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_270,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  pcVar4 = 
  "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  data[gl_LocalInvocationIndex] = texelFetch(g_sampler, ivec2(gl_LocalInvocationID), 0);\n  //data[gl_LocalInvocationIndex] = "
  ;
  poVar2 = std::operator<<(poVar2,
                           "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  data[gl_LocalInvocationIndex] = texelFetch(g_sampler, ivec2(gl_LocalInvocationID), 0);\n  //data[gl_LocalInvocationIndex] = "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            ((string *)&out_data,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&out_data);
  poVar2 = std::operator<<(poVar2,"vec4");
  poVar2 = tcu::operator<<(poVar2,expected_value);
  std::operator<<(poVar2,";\n}");
  std::__cxx11::string::~string((string *)&out_data);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  program_00 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,(string *)&m_buffer,false);
  std::__cxx11::string::~string((string *)&m_buffer);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&out_data,0x40,(allocator_type *)&os);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,0x400,
             out_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,program_00);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar3 = 0x400;
  this_02 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x400,1);
  uVar5 = 0;
  b = extraout_RDX;
  do {
    if (uVar5 == 0x40) {
      glu::CallLogWrapper::glDeleteTextures(this_00,2,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c54fc9:
      std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
                (&out_data.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
      glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::~ShortByteData(&d);
      return 0x3f < uVar5;
    }
    bVar1 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this_02,expected_value,b,(GLenum)uVar3);
    if (!bVar1) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_1b8,(Vector<int,_4> *)this_02);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>((string *)&os,local_1b8,v);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_1c8,expected_value);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_250,local_1c8,v_00);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_270,this_01,e_01);
      glcts::anon_unknown_0::Output
                ("[%d] Value is: %s. Value should be: %s. Format is: %s.\n",uVar5 & 0xffffffff,
                 os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                 local_250._M_dataplus._M_p,local_270._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&os);
      glu::CallLogWrapper::glDeleteTextures(this_00,2,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
      goto LAB_00c54fc9;
    }
    uVar5 = uVar5 + 1;
    this_02 = this_02 + 2;
    b = extraout_RDX_00;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		GLuint program = CreateComputeProgram(GenCS(internalformat, expected_value));

		const int		 kSize = 8;
		ShortByteData<T> d(kSize, value, internalformat, format);
		GLuint			 texture[2];
		glGenTextures(2, texture);

		/* read texture */
		{
			glBindTexture(GL_TEXTURE_2D, texture[0]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
			if (Shorts(internalformat))
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datas[0]);
			else if (Bytes(internalformat))
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datab[0]);
			else
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.data[0]);
		}
		/* write texture */
		{
			glBindTexture(GL_TEXTURE_2D, texture[1]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);

		glBindImageTexture(2, texture[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, texture[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glDispatchCompute(1, 1, 1);

		glBindTexture(GL_TEXTURE_2D, texture[1]);
		glMemoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(expected_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s.\n", i, ToString(map_data[i]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str());
				glDeleteTextures(2, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(2, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);

		return true;
	}